

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

_Bool ssl_prefs_check(Curl_easy *data)

{
  Curl_easy *data_local;
  
  if (((data->set).ssl.primary.version < 0) || (7 < (data->set).ssl.primary.version)) {
    Curl_failf(data,"Unrecognized parameter value passed via CURLOPT_SSLVERSION");
    data_local._7_1_ = false;
  }
  else {
    data_local._7_1_ = true;
  }
  return data_local._7_1_;
}

Assistant:

static bool ssl_prefs_check(struct Curl_easy *data)
{
  /* check for CURLOPT_SSLVERSION invalid parameter value */
  if((data->set.ssl.primary.version < 0)
     || (data->set.ssl.primary.version >= CURL_SSLVERSION_LAST)) {
    failf(data, "Unrecognized parameter value passed via CURLOPT_SSLVERSION");
    return FALSE;
  }
  return TRUE;
}